

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::BindDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::BindDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::BindDirectiveSyntax_*,_32UL,_16UL>_>
::nosize_transfer_element
          (void *param_1,arrays_type *param_2,undefined8 param_3,undefined8 param_4,
          table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::BindDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::BindDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::BindDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::BindDirectiveSyntax_*,_32UL,_16UL>_>
          *param_5)

{
  destroy_element_on_exit d;
  arrays_type *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  BindDirectiveSyntax **in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  arrays_type *arrays_;
  
  (param_5->
  super_empty_value<slang::detail::hashing::StackAllocator<const_slang::syntax::BindDirectiveSyntax_*,_32UL,_16UL>,_2U,_false>
  ).value_.storage =
       (Storage *)
       (((param_5->
         super_empty_value<slang::detail::hashing::StackAllocator<const_slang::syntax::BindDirectiveSyntax_*,_32UL,_16UL>,_2U,_false>
         ).value_.storage)->buffer + 1);
  arrays_ = param_2;
  position_for(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  flat_set_types<const_slang::syntax::BindDirectiveSyntax_*>::move((element_type *)param_2);
  table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::BindDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::BindDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::BindDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::BindDirectiveSyntax_const*,32ul,16ul>>
  ::nosize_unchecked_emplace_at<slang::syntax::BindDirectiveSyntax_const*>
            (param_5,arrays_,(size_t)param_1,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  destroy_element_on_exit::~destroy_element_on_exit((destroy_element_on_exit *)0x766e8b);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }